

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O0

RpcValue __thiscall
miniros::master::Master::getParamNames(Master *this,string *caller_id,Connection *param_3)

{
  bool bVar1;
  XmlRpcValue *rhs;
  reference pbVar2;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  anon_union_8_8_d5adaace_for__value extraout_RDX_00;
  anon_union_8_8_d5adaace_for__value aVar3;
  string *in_RSI;
  XmlRpcValue *in_RDI;
  RpcValue RVar4;
  string s;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  int index;
  RpcValue response;
  RpcValue *res;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff18;
  XmlRpcValue *in_stack_ffffffffffffff20;
  XmlRpcValue *this_00;
  XmlRpcValue *in_stack_ffffffffffffff50;
  XmlRpcValue *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  ParameterStorage *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff78;
  XmlRpcValue *in_stack_ffffffffffffff80;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  undefined1 local_70 [24];
  undefined1 *local_58;
  int local_4c;
  XmlRpcValue local_48 [2];
  undefined4 local_28;
  byte local_21;
  
  local_21 = 0;
  this_00 = in_RDI;
  XmlRpc::XmlRpcValue::Array((int)((ulong)in_RSI >> 0x20));
  local_28 = 1;
  rhs = XmlRpc::XmlRpcValue::operator[]
                  (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff50,(int *)rhs);
  XmlRpc::XmlRpcValue::operator[]
            (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  XmlRpc::XmlRpcValue::XmlRpcValue(local_48);
  local_4c = 0;
  ParameterStorage::getParamNames(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  local_58 = local_70;
  local_78._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ::std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_ffffffffffffff18);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end(in_stack_ffffffffffffff18);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffff20,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffff18);
    if (!bVar1) break;
    pbVar2 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_78);
    ::std::__cxx11::string::string((string *)&stack0xffffffffffffff60,(string *)pbVar2);
    XmlRpc::XmlRpcValue::XmlRpcValue(this_00,in_RSI);
    local_4c = local_4c + 1;
    in_stack_ffffffffffffff20 =
         XmlRpc::XmlRpcValue::operator[]
                   (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    XmlRpc::XmlRpcValue::operator=
              ((XmlRpcValue *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x52cfa8);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_78);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_RDI);
  XmlRpc::XmlRpcValue::operator[]
            (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58)
  ;
  local_21 = 1;
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x52d05e);
  aVar3 = extraout_RDX;
  if ((local_21 & 1) == 0) {
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x52d083);
    aVar3 = extraout_RDX_00;
  }
  RVar4._value.asDouble = aVar3.asDouble;
  RVar4._0_8_ = in_RDI;
  return RVar4;
}

Assistant:

Master::RpcValue Master::getParamNames(const std::string& caller_id, Connection*)
{
  RpcValue res = RpcValue::Array(3);
  res[0] = 1;
  res[1] = "getParamNames";

  RpcValue response;
  int index = 0;
  for (std::string s : m_parameterStorage.getParamNames(caller_id)) {
    response[index++] = s;
  }

  res[2] = response;
  return res;
}